

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestAds::testAdsReadReqEx2(TestAds *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  long lVar4;
  ostream *poVar5;
  byte bVar6;
  int i;
  int iVar7;
  bool bVar8;
  uint32_t bytesRead;
  uint32_t buffer;
  uint32_t outBuffer;
  AmsAddr unknown;
  uint local_70;
  int local_6c;
  string local_68;
  long local_48;
  undefined4 local_3c;
  AmsAddr local_38;
  
  local_48 = AdsPortOpenEx();
  bVar8 = local_48 != 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  paVar1 = &local_68.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  print(&server,this->out);
  local_3c = 0;
  lVar4 = AdsSyncWriteReqEx(local_48,&server,0x4020,0,4,&local_3c);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_68,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x13d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar7 = 0;
  do {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4020,0,4,&local_6c,&local_70);
    bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    if ((lVar4 != 0) != (bool)bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_68,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((local_70 != 4) != (bool)(bVar6 & 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_68,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x149);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((local_6c != 0) != (bool)(bVar6 & 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar8 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar8,&local_68,"0 == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x14a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 10);
  local_70 = 0xdeadbeef;
  lVar4 = AdsSyncReadReqEx2(0,&server,0x4020,0,4,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  paVar1 = &local_68.field_2;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x748,&local_68,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0xdeadbeef;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x151);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_70 = 0xdeadbeef;
  lVar4 = AdsSyncReadReqEx2(local_48,(AmsAddr *)0x0,0x4020,0,4,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x749,&local_68,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x156);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0xdeadbeef;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x157);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_70 = 0xdeadbeef;
  AmsNetId::AmsNetId(&local_38.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_38.port = 0x353;
  lVar4 = AdsSyncReadReqEx2(local_48,&local_38,0x4020,0,4,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 7,&local_68,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x15d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x15e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_6c = -0x21524111;
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4020,0,4,&local_6c,(uint *)0x0);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_68,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x162);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_6c == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x163);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4020,0,4,(void *)0x0,(uint *)0x0);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_68,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x167);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4020,0,4,(void *)0x0,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x741,&local_68,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x169);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_70 = 0xdeadbeef;
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4020,0,0,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_68,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x16e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_70 = 0xdeadbeef;
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0,0,4,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_68,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x174);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x175);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_70 = 0xdeadbeef;
  lVar4 = AdsSyncReadReqEx2(local_48,&server,0x4025,0x10000,4,&local_6c,&local_70);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0x701,&local_68,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x17a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  bVar8 = local_70 == 0;
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar8,&local_68,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  lVar4 = AdsPortCloseEx(local_48);
  ptVar2 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar4 == 0,&local_68,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x17c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void testAdsReadReqEx2(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        const uint32_t outBuffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        uint32_t bytesRead;
        uint32_t buffer;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, 0 == buffer);
        }

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadReqEx2(0, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadReqEx2(port, nullptr, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadReqEx2(port, &unknown, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, nullptr));
        fructose_assert(0 == buffer);

        // provide nullptr to buffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), nullptr, &bytesRead));

        // provide 0 length buffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, 0, &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        //TODO is this a bug? Shouldn't the request fail with ADSERR_DEVICE_INVALIDSIZE?

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }